

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-cardinalities.cc
# Opt level: O2

void __thiscall
testing::anon_unknown_6::BetweenCardinalityImpl::DescribeTo
          (BetweenCardinalityImpl *this,ostream *os)

{
  int iVar1;
  ostream *poVar2;
  int n;
  int n_00;
  int n_01;
  char *pcVar3;
  string local_30;
  
  iVar1 = this->max_;
  if (this->min_ != 0) {
    if (this->min_ == iVar1) {
      poVar2 = std::operator<<(os,"called ");
      (anonymous_namespace)::FormatTimes_abi_cxx11_
                (&local_30,(_anonymous_namespace_ *)(ulong)(uint)this->min_,n);
      std::operator<<(poVar2,(string *)&local_30);
    }
    else {
      if (iVar1 != 0x7fffffff) {
        poVar2 = std::operator<<(os,"called between ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->min_);
        poVar2 = std::operator<<(poVar2," and ");
        os = (ostream *)std::ostream::operator<<(poVar2,this->max_);
        pcVar3 = " times";
        goto LAB_0017dd02;
      }
      poVar2 = std::operator<<(os,"called at least ");
      (anonymous_namespace)::FormatTimes_abi_cxx11_
                (&local_30,(_anonymous_namespace_ *)(ulong)(uint)this->min_,n_00);
      std::operator<<(poVar2,(string *)&local_30);
    }
LAB_0017dd3e:
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  if (iVar1 == 0x7fffffff) {
    pcVar3 = "called any number of times";
  }
  else {
    if (iVar1 != 0) {
      poVar2 = std::operator<<(os,"called at most ");
      (anonymous_namespace)::FormatTimes_abi_cxx11_
                (&local_30,(_anonymous_namespace_ *)(ulong)(uint)this->max_,n_01);
      std::operator<<(poVar2,(string *)&local_30);
      goto LAB_0017dd3e;
    }
    pcVar3 = "never called";
  }
LAB_0017dd02:
  std::operator<<(os,pcVar3);
  return;
}

Assistant:

void BetweenCardinalityImpl::DescribeTo(::std::ostream* os) const {
  if (min_ == 0) {
    if (max_ == 0) {
      *os << "never called";
    } else if (max_ == INT_MAX) {
      *os << "called any number of times";
    } else {
      *os << "called at most " << FormatTimes(max_);
    }
  } else if (min_ == max_) {
    *os << "called " << FormatTimes(min_);
  } else if (max_ == INT_MAX) {
    *os << "called at least " << FormatTimes(min_);
  } else {
    // 0 < min_ < max_ < INT_MAX
    *os << "called between " << min_ << " and " << max_ << " times";
  }
}